

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readMetadata.hpp
# Opt level: O2

Base * __thiscall
njoy::ENDFtk::ListRecord::
readMetadata<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (Base *__return_storage_ptr__,ListRecord *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT)

{
  char *in_RAX;
  runtime_error *this_00;
  
  record::
  Base<njoy::ENDFtk::record::Real,njoy::ENDFtk::record::Real,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>>
  ::Base<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((Base<njoy::ENDFtk::record::Real,njoy::ENDFtk::record::Real,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>>
              *)__return_storage_ptr__,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,it);
  verifyTail<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,it,(long *)end,(int)lineNumber,MAT,MF);
  if (-1 < (__return_storage_ptr__->fields).
           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
           super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl) {
    return __return_storage_ptr__;
  }
  tools::Log::error<char_const*>(in_RAX);
  tools::Log::info<char_const*>(in_RAX);
  tools::Log::info<char_const*,long>
            ("NPL value: ",
             (__return_storage_ptr__->fields).
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>
             .super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"List Record NPL value");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static Base
readMetadata
( Iterator& it, const Iterator& end, long& lineNumber, int MAT, int MF, int MT ){
  try{
    Base metadata( it, end );
    verifyTail( it, end, lineNumber, MAT, MF, MT );
    if ( std::get<4>( metadata.fields ) < 0 ){
      Log::error( "Illegal NPL value encountered" );
      Log::info( "NPL must be greater than or equal to 0" );
      Log::info( "NPL value: ", std::get<4>( metadata.fields ) );
      throw std::runtime_error( "List Record NPL value" );
    }
    return metadata;
  } catch ( std::exception& e ){
    Log::info( "Error while reading metadata" );
    throw e;
  }
}